

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiListClipperData>::resize
          (ImVector<ImGuiListClipperData> *this,int new_size,ImGuiListClipperData *v)

{
  undefined8 *puVar1;
  ImGuiListClipperData *pIVar2;
  ImGuiListClipper *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  iVar8 = this->Capacity;
  if (iVar8 < new_size) {
    if (iVar8 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar8 / 2 + iVar8;
    }
    if (iVar8 <= new_size) {
      iVar8 = new_size;
    }
    reserve(this,iVar8);
  }
  lVar6 = (long)this->Size;
  if (this->Size < new_size) {
    lVar7 = lVar6 * 0x28;
    for (; lVar6 < new_size; lVar6 = lVar6 + 1) {
      pIVar2 = this->Data;
      *(ImGuiListClipperRange **)((long)&(pIVar2->Ranges).Data + lVar7) = (v->Ranges).Data;
      pIVar3 = v->ListClipper;
      uVar4 = *(undefined8 *)&v->LossynessOffset;
      uVar5 = *(undefined8 *)&v->Ranges;
      puVar1 = (undefined8 *)((long)&pIVar2->ItemsFrozen + lVar7);
      *puVar1 = *(undefined8 *)&v->ItemsFrozen;
      puVar1[1] = uVar5;
      puVar1 = (undefined8 *)((long)&pIVar2->ListClipper + lVar7);
      *puVar1 = pIVar3;
      puVar1[1] = uVar4;
      lVar7 = lVar7 + 0x28;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }